

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O0

void __thiscall gfx::Program::check_validation(Program *this,GLuint shader)

{
  GLuint GVar1;
  PFNGLGETPROGRAMINFOLOGPROC p_Var2;
  undefined4 uVar3;
  size_type __n;
  reference pvVar4;
  runtime_error *this_00;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string err;
  allocator_type local_39;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> info_log;
  GLint local_18;
  GLint max_length;
  GLint is_ok;
  GLuint shader_local;
  Program *this_local;
  
  local_18 = 0;
  max_length = shader;
  _is_ok = this;
  (*glad_glGetProgramiv)(this->id,0x8b83,&local_18);
  if (local_18 == 0) {
    info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
    (*glad_glGetProgramiv)
              (this->id,0x8b84,
               (GLint *)&info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14
              );
    __n = (size_type)(int)info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_38,__n,&local_39);
    std::allocator<char>::~allocator(&local_39);
    uVar3 = info_log.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
    p_Var2 = glad_glGetProgramInfoLog;
    GVar1 = this->id;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_38,0);
    (*p_Var2)(GVar1,uVar3,(GLsizei *)0x0,pvVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,"GLSL validation error for program: ",&local_71);
    std::allocator<char>::~allocator(&local_71);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &this->name);
    std::operator+(&local_b8,&local_d8,"\n");
    __rhs = std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)local_38);
    std::operator+(&local_98,&local_b8,__rhs);
    std::runtime_error::runtime_error(this_00,(string *)&local_98);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void check_validation(GLuint shader) {
        GLint is_ok = 0;
        glGetProgramiv(id, GL_VALIDATE_STATUS, &is_ok);
        if (!is_ok) {
			GLint max_length = 0;
            glGetProgramiv(id, GL_INFO_LOG_LENGTH, &max_length);

            // The maxLength includes the NULL character
            std::vector<GLchar> info_log(max_length);
            glGetProgramInfoLog(id, max_length, NULL, &info_log[0]);

            const std::string err = "GLSL validation error for program: ";
            throw std::runtime_error(err + name + "\n" + info_log.data());
		}
    }